

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS ref_metric_olympic_node(REF_NODE ref_node,REF_DBL h)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  
  lVar2 = 2;
  lVar3 = 0;
  do {
    if (ref_node->max <= lVar3) {
      return 0;
    }
    if (-1 < ref_node->global[lVar3]) {
      dVar4 = ref_node->real[lVar2] + -0.5;
      if (dVar4 <= -dVar4) {
        dVar4 = -dVar4;
      }
      dVar4 = dVar4 * (0.1 - h);
      dVar4 = dVar4 + dVar4 + h;
      uVar1 = ref_node_metric_form
                        (ref_node,(REF_INT)lVar3,99.99999999999999,0.0,0.0,99.99999999999999,0.0,
                         1.0 / (dVar4 * dVar4));
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x58,"ref_metric_olympic_node",(ulong)uVar1,"set node met");
        return uVar1;
      }
    }
    lVar3 = lVar3 + 1;
    lVar2 = lVar2 + 0xf;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_metric_olympic_node(REF_NODE ref_node, REF_DBL h) {
  REF_INT node;
  REF_DBL hh;

  each_ref_node_valid_node(ref_node, node) {
    hh = h + (0.1 - h) * ABS(ref_node_xyz(ref_node, 2, node) - 0.5) / 0.5;
    RSS(ref_node_metric_form(ref_node, node, 1.0 / (0.1 * 0.1), 0, 0,
                             1.0 / (0.1 * 0.1), 0, 1.0 / (hh * hh)),
        "set node met");
  }

  return REF_SUCCESS;
}